

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_writer.cc
# Opt level: O1

void __thiscall FileWriter::FileWriter(FileWriter *this,string *prefix)

{
  pointer pcVar1;
  
  (this->prefix_)._M_dataplus._M_p = (pointer)&(this->prefix_).field_2;
  pcVar1 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar1,pcVar1 + prefix->_M_string_length)
  ;
  this->force_ = false;
  return;
}

Assistant:

FileWriter::FileWriter(const std::string& prefix) : prefix_(prefix) {
  force_ = false;
}